

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O1

TestLog * deqp::gles2::Functional::DepthStencilCaseUtil::operator<<
                    (TestLog *log,DepthStencilParams *params)

{
  ostringstream *poVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [384];
  
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Stencil test: ",0xe);
  pcVar3 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  pcVar2 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if ((ulong)params->stencilTestEnabled != 0) {
    pcVar2 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,pcVar2 + 0x27,8 - (ulong)params->stencilTestEnabled);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  if (params->stencilTestEnabled == true) {
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Front-face stencil state: ",0x1a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
    operator<<(log,params->stencil);
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Back-face stencil state: ",0x19);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
    operator<<(log,params->stencil + 1);
  }
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Depth test: ",0xc);
  if ((ulong)params->depthTestEnabled != 0) {
    pcVar3 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,pcVar3 + 0x27,8 - (ulong)params->depthTestEnabled);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  if (params->depthTestEnabled == true) {
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"  func = ",9);
    local_1b8.m_value = params->depthFunc;
    local_1b8.m_getName = glu::getCompareFuncName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n  depth value = ",0x11);
    std::ostream::_M_insert<double>((double)params->depth);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n  write mask = ",0x10);
    pcVar3 = "false";
    if ((ulong)params->depthWriteMask != 0) {
      pcVar3 = "true";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,pcVar3,(ulong)params->depthWriteMask ^ 5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  }
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Triangles are ",0xe);
  bVar4 = params->visibleFace == FACETYPE_FRONT;
  pcVar3 = "back";
  if (bVar4) {
    pcVar3 = "front";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar3,(ulong)bVar4 | 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"-facing",7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const DepthStencilParams& params)
{
	log << TestLog::Message << "Stencil test: " << (params.stencilTestEnabled ? "enabled" : "disabled") << TestLog::EndMessage;
	if (params.stencilTestEnabled)
	{
		log << TestLog::Message << "Front-face stencil state: " << TestLog::EndMessage;
		log << params.stencil[rr::FACETYPE_FRONT];

		log << TestLog::Message << "Back-face stencil state: " << TestLog::EndMessage;
		log << params.stencil[rr::FACETYPE_BACK];
	}

	log << TestLog::Message << "Depth test: " << (params.depthTestEnabled ? "enabled" : "disabled") << TestLog::EndMessage;
	if (params.depthTestEnabled)
	{
		log << TestLog::Message << "  func = " << glu::getCompareFuncStr(params.depthFunc) << "\n"
								   "  depth value = " << params.depth << "\n"
								   "  write mask = " << (params.depthWriteMask ? "true" : "false") << "\n"
			<< TestLog::EndMessage;
	}

	log << TestLog::Message << "Triangles are " << (params.visibleFace == rr::FACETYPE_FRONT ? "front" : "back") << "-facing" << TestLog::EndMessage;

	return log;
}